

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

optional_ptr<duckdb::SchemaCatalogEntry,_true>
duckdb::Catalog::GetSchema
          (CatalogEntryRetriever *retriever,string *catalog_name,EntryLookupInfo *schema_lookup,
          OnEntryNotFound if_not_found)

{
  QueryErrorContext error_context;
  pointer pcVar1;
  optional_ptr<duckdb::Catalog,_true> oVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  OnEntryNotFound OVar5;
  int iVar6;
  reference catalog_name_00;
  undefined4 extraout_var;
  CatalogException *this;
  size_type __n;
  bool bVar7;
  optional_ptr<duckdb::Catalog,_true> catalog;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  optional_ptr<duckdb::Catalog,_true> local_a0;
  undefined1 local_98 [32];
  CatalogTransaction local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  SchemaCatalogEntry *__return_storage_ptr__;
  
  __return_storage_ptr__ = (SchemaCatalogEntry *)local_98;
  local_98._24_8_ = catalog_name;
  GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)__return_storage_ptr__,retriever,
                    catalog_name,schema_lookup->name);
  if (local_98._8_8_ != local_98._0_8_) {
    __n = 0;
    do {
      catalog_name_00 =
           vector<duckdb::CatalogSearchEntry,_true>::operator[]
                     ((vector<duckdb::CatalogSearchEntry,_true> *)local_98,__n);
      local_a0 = GetCatalogEntry(retriever,&catalog_name_00->catalog);
      uVar4 = local_98._8_8_;
      uVar3 = local_98._0_8_;
      if (local_a0.ptr == (Catalog *)0x0) {
        bVar7 = false;
      }
      else {
        optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_a0);
        oVar2.ptr = local_a0.ptr;
        CatalogTransaction::CatalogTransaction
                  ((CatalogTransaction *)(local_98 + 0x20),local_a0.ptr,retriever->context);
        OVar5 = RETURN_NULL;
        if (__n + 1 == (long)(uVar4 - uVar3) >> 6) {
          OVar5 = if_not_found;
        }
        iVar6 = (*(oVar2.ptr)->_vptr_Catalog[8])(oVar2.ptr,schema_lookup,(ulong)OVar5);
        __return_storage_ptr__ = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar6);
        bVar7 = __return_storage_ptr__ != (SchemaCatalogEntry *)0x0;
      }
      if (bVar7) goto LAB_002624a1;
      __n = __n + 1;
    } while (__n < (ulong)((long)(local_98._8_8_ - local_98._0_8_) >> 6));
  }
  if (if_not_found == THROW_EXCEPTION) {
    this = (CatalogException *)__cxa_allocate_exception(0x10);
    error_context.query_location.index =
         (optional_idx)(schema_lookup->error_context).query_location.index;
    local_78.db.ptr = (DatabaseInstance *)&local_78.transaction;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_98 + 0x20),"Catalog with name %s does not exist!","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = ((_Alloc_hider *)local_98._24_8_)->_M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,
               pcVar1 + (((mutex *)(local_98._24_8_ + 8))->super___mutex_base)._M_mutex.__align);
    CatalogException::CatalogException<std::__cxx11::string>
              (this,error_context,(string *)(local_98 + 0x20),&local_50);
    __cxa_throw(this,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  __return_storage_ptr__ = (SchemaCatalogEntry *)0x0;
LAB_002624a1:
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            ((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *)
             local_98);
  return (optional_ptr<duckdb::SchemaCatalogEntry,_true>)__return_storage_ptr__;
}

Assistant:

optional_ptr<SchemaCatalogEntry> Catalog::GetSchema(CatalogEntryRetriever &retriever, const string &catalog_name,
                                                    const EntryLookupInfo &schema_lookup,
                                                    OnEntryNotFound if_not_found) {
	auto entries = GetCatalogEntries(retriever, catalog_name, schema_lookup.GetEntryName());
	for (idx_t i = 0; i < entries.size(); i++) {
		auto catalog = Catalog::GetCatalogEntry(retriever, entries[i].catalog);
		if (!catalog) {
			// skip if it is not an attached database
			continue;
		}
		const auto on_not_found = i + 1 == entries.size() ? if_not_found : OnEntryNotFound::RETURN_NULL;
		auto result = catalog->GetSchema(retriever.GetContext(), schema_lookup, on_not_found);
		if (result) {
			return result;
		}
	}
	// Catalog has not been found.
	if (if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
		throw CatalogException(schema_lookup.GetErrorContext(), "Catalog with name %s does not exist!", catalog_name);
	}
	return nullptr;
}